

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintLatch(FILE *pFile,Abc_Ntk_t *pNtk)

{
  Abc_NtkType_t AVar1;
  long *plVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  uint uVar4;
  long lVar5;
  Abc_Obj_t *pLatch;
  int i;
  undefined8 *puVar6;
  int iVar7;
  int InitNums [4];
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                  ,0x203,"void Abc_NtkPrintLatch(FILE *, Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] == 0) {
    fwrite("The network is combinational.\n",0x1e,1,(FILE *)pFile);
    return;
  }
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    InitNums[lVar5] = 0;
  }
  iVar7 = 0;
  i = 0;
  do {
    if (pNtk->vBoxes->nSize <= i) {
      fprintf((FILE *)pFile,
              "Total latches = %5d. Init0 = %d. Init1 = %d. InitDC = %d. Const data = %d.\n",
              (ulong)(uint)pNtk->nObjCounts[8],(ulong)(uint)InitNums[1],(ulong)(uint)InitNums[2],
              (ulong)(uint)InitNums[3],iVar7);
      return;
    }
    pLatch = Abc_NtkBox(pNtk,i);
    uVar4 = *(uint *)&pLatch->field_0x14;
    if ((uVar4 & 0xf) == 8) {
      iVar3 = (pLatch->field_5).iData;
      if (3 < iVar3) {
        __assert_fail("Init < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                      ,0x210,"void Abc_NtkPrintLatch(FILE *, Abc_Ntk_t *)");
      }
      InitNums[iVar3] = InitNums[iVar3] + 1;
      plVar2 = (long *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanins).pArray];
      pNode = *(Abc_Obj_t **)
               (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        puVar6 = (undefined8 *)((ulong)pNode & 0xfffffffffffffffe);
        if (*(int *)*puVar6 != 3) {
          __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
        }
        if ((*(uint *)((long)puVar6 + 0x14) & 0xf) == 1) goto LAB_002a674f;
      }
      else {
        if (pNtk->ntkType != ABC_NTK_LOGIC) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                        ,0x21f,"void Abc_NtkPrintLatch(FILE *, Abc_Ntk_t *)");
        }
        iVar3 = Abc_NodeIsConst(pNode);
        if (iVar3 != 0) {
          uVar4 = *(uint *)&pLatch->field_0x14;
LAB_002a674f:
          if ((uVar4 & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x1aa,"int Abc_LatchIsInitDc(Abc_Obj_t *)");
          }
          iVar7 = iVar7 + 1;
          if ((pLatch->field_5).pData != (void *)0x3) {
            AVar1 = pNtk->ntkType;
            Abc_LatchIsInit1(pLatch);
            if (AVar1 != ABC_NTK_STRASH) {
              plVar2 = (long *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanins).pArray];
              Abc_NodeIsConst1(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                (long)*(int *)plVar2[4] * 8));
            }
          }
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_NtkPrintLatch( FILE * pFile, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pLatch, * pFanin;
    int i, Counter0, Counter1, Counter2;
    int InitNums[4], Init;

    assert( !Abc_NtkIsNetlist(pNtk) );
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        fprintf( pFile, "The network is combinational.\n" );
        return;
    }

    for ( i = 0; i < 4; i++ )
        InitNums[i] = 0;
    Counter0 = Counter1 = Counter2 = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        Init = Abc_LatchInit( pLatch );
        assert( Init < 4 );
        InitNums[Init]++;

        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pLatch));
        if ( Abc_NtkIsLogic(pNtk) )
        {
            if ( !Abc_NodeIsConst(pFanin) )
                continue;
        }
        else if ( Abc_NtkIsStrash(pNtk) )
        {
            if ( !Abc_AigNodeIsConst(pFanin) )
                continue;
        }
        else
            assert( 0 );

        // the latch input is a constant node
        Counter0++;
        if ( Abc_LatchIsInitDc(pLatch) )
        {
            Counter1++;
            continue;
        }
        // count the number of cases when the constant is equal to the initial value
        if ( Abc_NtkIsStrash(pNtk) )
        {
            if ( Abc_LatchIsInit1(pLatch) == !Abc_ObjFaninC0(pLatch) )
                Counter2++;
        }
        else
        {
            if ( Abc_LatchIsInit1(pLatch) == Abc_NodeIsConst1(Abc_ObjFanin0(Abc_ObjFanin0(pLatch))) )
                Counter2++;
        }
    }
//    fprintf( pFile, "%-15s:  ", pNtk->pName );
    fprintf( pFile, "Total latches = %5d. Init0 = %d. Init1 = %d. InitDC = %d. Const data = %d.\n",
        Abc_NtkLatchNum(pNtk), InitNums[1], InitNums[2], InitNums[3], Counter0 );
//    fprintf( pFile, "Const fanin = %3d. DC init = %3d. Matching init = %3d. ", Counter0, Counter1, Counter2 );
//    fprintf( pFile, "Self-feed latches = %2d.\n", -1 ); //Abc_NtkCountSelfFeedLatches(pNtk) );
}